

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  wchar_t wVar1;
  alignment aVar2;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  *in_RDX;
  align_spec *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff18;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_d0;
  ostream_type *local_c0;
  char *local_b8;
  char *in_stack_ffffffffffffff58;
  ostream_type *in_stack_ffffffffffffff60;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  *in_stack_ffffffffffffff70;
  ostream_type *local_80;
  char *local_78;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_68;
  ostream_type *local_58;
  char *local_50;
  long local_48;
  undefined1 local_39;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_38;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *local_30;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *local_28;
  uint local_1c;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  *local_18;
  align_spec *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = align_spec::width(in_RSI);
  local_30 = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
              *)basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                ::
                padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                ::size(local_18);
  local_28 = local_30;
  if (local_1c != 0) {
    local_30 = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                *)basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                  ::
                  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                  ::width(local_18);
  }
  if (local_30 <
      (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
       *)(ulong)local_1c) {
    local_38 = basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ::reserve(local_30,in_stack_ffffffffffffff18);
    wVar1 = align_spec::fill(local_10);
    local_39 = (undefined1)wVar1;
    local_48 = (ulong)local_1c - (long)local_30;
    aVar2 = align_spec::align(local_10);
    if (aVar2 == ALIGN_RIGHT) {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_68,local_38);
      std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
                (in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
      local_38->_M_stream = local_58;
      local_38->_M_string = local_50;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
      ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      aVar2 = align_spec::align(local_10);
      if (aVar2 == ALIGN_CENTER) {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
                  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffff70
                   ,local_38);
        std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
                  (in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58);
        local_38->_M_stream = local_80;
        local_38->_M_string = local_78;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
        ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
                  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffff50
                   ,local_38);
        std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
                  (in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58);
        local_38->_M_stream = in_stack_ffffffffffffff60;
        local_38->_M_string = (char *)in_stack_ffffffffffffff68;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
        ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
                  (&local_d0,local_38);
        std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
                  (in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58);
        local_38->_M_stream = local_c0;
        local_38->_M_string = local_b8;
      }
    }
  }
  else {
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::reserve(local_30,(size_t)local_18);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }